

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O3

void __thiscall
cpptrace::stacktrace::print_with_snippets
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  string *psVar4;
  uint uVar5;
  int *piVar6;
  size_t sVar7;
  undefined7 in_register_00000011;
  ulong target_line;
  uint frame_number_width;
  size_t counter;
  char *__s;
  string *path;
  string local_58;
  stacktrace *local_38;
  
  local_38 = this;
  if ((int)CONCAT71(in_register_00000011,color) != 0) {
    if (stream == (ostream *)&std::cout) {
      piVar6 = &stdout_fileno;
    }
    else {
      if (stream != (ostream *)&std::cerr) goto LAB_00132100;
      piVar6 = &stderr_fileno;
    }
    ::isatty(*piVar6);
  }
LAB_00132100:
  __s = "Stack trace (most recent call first):";
  if (header != (char *)0x0) {
    __s = header;
  }
  sVar7 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar7);
  local_58._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  psVar1 = (local_38->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (local_38->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == psVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"<empty trace>",0xd);
    local_58._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  }
  else {
    uVar5 = (int)((ulong)((long)psVar2 - (long)psVar1) >> 5) * -0x55555555 - 1;
    frame_number_width = 1;
    if (9 < uVar5) {
      do {
        frame_number_width = frame_number_width + 1;
        bVar3 = 99 < uVar5;
        uVar5 = uVar5 / 10;
      } while (bVar3);
    }
    counter = 0;
    path = &psVar1->filename;
    do {
      print_frame(stream,color,frame_number_width,counter,
                  (stacktrace_frame *)&path[-1]._M_string_length);
      if ((newline_at_end) ||
         ((pointer)&path[-1]._M_string_length !=
          (local_38->frames).
          super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1)) {
        local_58._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
      }
      target_line = (ulong)*(uint *)((long)&path[-1].field_2 + 8);
      if ((target_line != 0xffffffff) && (path->_M_string_length != 0)) {
        detail::get_snippet(&local_58,path,target_line,2,color);
        std::__ostream_insert<char,std::char_traits<char>>
                  (stream,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                           local_58._M_dataplus._M_p._0_1_),
                   local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
      }
      counter = counter + 1;
      psVar4 = path + 2;
      path = path + 3;
    } while ((pointer)&psVar4->_M_string_length != psVar2);
  }
  return;
}

Assistant:

void stacktrace::print_with_snippets(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>" << '\n';
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            if(frame.line.has_value() && !frame.filename.empty()) {
                stream << detail::get_snippet(frame.filename, frame.line.value(), 2, color);
            }
            counter++;
        }
    }